

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GLTypeConversions.cpp
# Opt level: O0

void __thiscall
Diligent::anon_unknown_1::InternalTexFormatToTexFormatMap::~InternalTexFormatToTexFormatMap
          (InternalTexFormatToTexFormatMap *this)

{
  InternalTexFormatToTexFormatMap *this_local;
  
  std::
  unordered_map<unsigned_int,_Diligent::TEXTURE_FORMAT,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_Diligent::TEXTURE_FORMAT>_>_>
  ::~unordered_map(&this->m_FormatMap);
  return;
}

Assistant:

InternalTexFormatToTexFormatMap()
    {
        for (TEXTURE_FORMAT TexFmt = TEX_FORMAT_UNKNOWN; TexFmt < TEX_FORMAT_NUM_FORMATS; TexFmt = static_cast<TEXTURE_FORMAT>(static_cast<int>(TexFmt) + 1))
        {
            auto ComponentType = GetTextureFormatAttribs(TexFmt).ComponentType;
            if (ComponentType == COMPONENT_TYPE_UNDEFINED ||
                ComponentType == COMPONENT_TYPE_DEPTH_STENCIL || // Skip depth-stencil
                TexFmt == TEX_FORMAT_RGB10A2_TYPELESS ||         // and typeless formats
                TexFmt == TEX_FORMAT_BC1_TYPELESS ||
                TexFmt == TEX_FORMAT_BC2_TYPELESS ||
                TexFmt == TEX_FORMAT_BC3_TYPELESS ||
                TexFmt == TEX_FORMAT_BC4_TYPELESS ||
                TexFmt == TEX_FORMAT_BC5_TYPELESS ||
                TexFmt == TEX_FORMAT_BC6H_TYPELESS ||
                TexFmt == TEX_FORMAT_BC7_TYPELESS ||
                TexFmt == TEX_FORMAT_A8_UNORM || // A8 is implemented by swizzling R8
                TexFmt == TEX_FORMAT_BGRA8_UNORM // BGRA8 is implemented by swizzling RGBA8
            )
            {
                continue;
            }

            auto GlTexFormat = TexFormatToGLInternalTexFormat(TexFmt);
            if (GlTexFormat != 0)
            {
                VERIFY_EXPR(m_FormatMap.find(GlTexFormat) == m_FormatMap.end());
                m_FormatMap[GlTexFormat] = TexFmt;
            }
            m_FormatMap[TexFormatToGLInternalTexFormat(TEX_FORMAT_D32_FLOAT_S8X24_UINT)] = TEX_FORMAT_D32_FLOAT_S8X24_UINT;
            m_FormatMap[TexFormatToGLInternalTexFormat(TEX_FORMAT_D24_UNORM_S8_UINT)]    = TEX_FORMAT_D24_UNORM_S8_UINT;
        }
    }